

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O2

utf8proc_ssize_t
utf8proc_decompose_char
          (utf8proc_int32_t uc,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  ushort uVar1;
  utf8proc_bool uVar2;
  utf8proc_property_t *puVar3;
  utf8proc_ssize_t uVar4;
  utf8proc_uint16_t seqindex;
  utf8proc_option_t options_00;
  uint uVar5;
  short sVar6;
  utf8proc_option_t uVar7;
  uint uc_00;
  
  uVar7 = options & ~UTF8PROC_LUMP;
LAB_0011b4b4:
  do {
    do {
      while( true ) {
        do {
          uc_00 = uc;
          options_00 = options;
          if (0x10ffff < uc_00) {
            return -4;
          }
          puVar3 = unsafe_get_property(uc_00);
          uVar5 = uc_00 - 0xac00;
          if (uVar5 < 0x2ba4 && (options_00 & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0) {
            if (0 < bufsize) {
              *dst = (uint)(ushort)((ushort)((uVar5 & 0xffff) / 0x24c) | 0x1100);
              if (bufsize == 1) {
                return 3 - (ulong)((short)((uVar5 & 0xffff) % 0x1c) == 0);
              }
              dst[1] = (uint)(ushort)((short)(((uVar5 & 0xffff) % 0x24c) / 0x1c) + 0x1161);
            }
            sVar6 = (short)((uVar5 & 0xffff) % 0x1c);
            if (sVar6 != 0) {
              if (bufsize < 3) {
                return 3;
              }
              dst[2] = (uint)(ushort)(sVar6 + 0x11a7);
              return 3;
            }
            return 2;
          }
          uVar1 = puVar3->category;
          if (uVar1 == 0 && (options_00 & UTF8PROC_REJECTNA) != 0) {
            return -4;
          }
          if ((((options_00 & UTF8PROC_IGNORE) != 0) && ((puVar3->field_0x14 & 4) != 0)) ||
             ((options_00 >> 0xe & 1) != 0 && uVar1 == 0)) goto LAB_0011b709;
          if ((options_00 >> 0xc & 1) == 0) goto LAB_0011b6f6;
          options = uVar7;
          uc = 0x20;
        } while (((uVar1 == 0x17) || (uc = 0x27, (uc_00 & 0x1ffffe) == 0x2018)) ||
                ((uc = 0x27, uc_00 == 700 ||
                 ((uc = 0x27, uc_00 == 0x2c8 || (uc = 0x2d, uc_00 == 0x2212 || uVar1 == 0xd))))));
        if (uc_00 == 0x2039) goto LAB_0011b626;
        if (uc_00 != 0x203a) break;
LAB_0011b630:
        uc = 0x3e;
      }
      uc = 0x2f;
    } while ((uc_00 == 0x2044) || (uc_00 == 0x2215));
    if (uc_00 != 0x2216) break;
    uc = 0x5c;
  } while( true );
  if (uc_00 == 0x3009) goto LAB_0011b630;
  if (uc_00 == 0x2329) {
LAB_0011b626:
    uc = 0x3c;
  }
  else {
    if (uc_00 == 0x232a) goto LAB_0011b630;
    if (uc_00 == 0x3008) goto LAB_0011b626;
    if (uc_00 == 0x2236) {
      uc = 0x3a;
    }
    else {
      uc = 0x5e;
      if (((((uc_00 & 0x1ffffd) != 0x2c4) && (uc_00 != 0x2038)) && (uc_00 != 0x2303)) &&
         ((uc = 0x5f, uc_00 != 0x2cd && uVar1 != 0xc && (uc = 0x60, uc_00 != 0x2cb)))) {
        if (uc_00 == 0x223c) {
          uc = 0x7e;
        }
        else if (uc_00 == 0x2223) {
          uc = 0x7c;
        }
        else if (((~options_00 & 0x180) != 0) || (uc = 10, (uVar1 & 0xfffe) != 0x18)) {
LAB_0011b6f6:
          if (((byte)(options_00 >> 0xd) & (ushort)(uVar1 - 6) < 3) == 0) {
            if ((((options_00 >> 10 & 1) != 0) &&
                (seqindex = puVar3->casefold_seqindex, seqindex != 0xffff)) ||
               ((((options_00 & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0 &&
                 (seqindex = puVar3->decomp_seqindex, seqindex != 0xffff)) &&
                (((options_00 & UTF8PROC_COMPAT) != 0 || (puVar3->decomp_type == 0)))))) {
              uVar4 = seqindex_write_char_decomposed
                                (seqindex,dst,bufsize,options_00,last_boundclass);
              return uVar4;
            }
            if (((options_00 >> 0xb & 1) != 0) &&
               (uVar2 = grapheme_break_extended
                                  (*last_boundclass,(uint)(byte)puVar3->field_0x15,last_boundclass),
               uVar2)) {
              if (bufsize < 1) {
                return 2;
              }
              *dst = 0xffff;
              if (bufsize == 1) {
                return 2;
              }
              dst[1] = uc_00;
              return 2;
            }
            uVar4 = 1;
            if (0 < bufsize) {
              *dst = uc_00;
            }
          }
          else {
LAB_0011b709:
            uVar4 = 0;
          }
          return uVar4;
        }
      }
    }
  }
  goto LAB_0011b4b4;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_char(utf8proc_int32_t uc, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  const utf8proc_property_t *property;
  utf8proc_propval_t category;
  utf8proc_int32_t hangul_sindex;
  if (uc < 0 || uc >= 0x110000) return UTF8PROC_ERROR_NOTASSIGNED;
  property = unsafe_get_property(uc);
  category = property->category;
  hangul_sindex = uc - UTF8PROC_HANGUL_SBASE;
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT) {
      utf8proc_int32_t hangul_tindex;
      if (bufsize >= 1) {
        dst[0] = UTF8PROC_HANGUL_LBASE +
          hangul_sindex / UTF8PROC_HANGUL_NCOUNT;
        if (bufsize >= 2) dst[1] = UTF8PROC_HANGUL_VBASE +
          (hangul_sindex % UTF8PROC_HANGUL_NCOUNT) / UTF8PROC_HANGUL_TCOUNT;
      }
      hangul_tindex = hangul_sindex % UTF8PROC_HANGUL_TCOUNT;
      if (!hangul_tindex) return 2;
      if (bufsize >= 3) dst[2] = UTF8PROC_HANGUL_TBASE + hangul_tindex;
      return 3;
    }
  }
  if (options & UTF8PROC_REJECTNA) {
    if (!category) return UTF8PROC_ERROR_NOTASSIGNED;
  }
  if (options & UTF8PROC_IGNORE) {
    if (property->ignorable) return 0;
  }
  if (options & UTF8PROC_STRIPNA) {
    if (!category) return 0;
  }
  if (options & UTF8PROC_LUMP) {
    if (category == UTF8PROC_CATEGORY_ZS) utf8proc_decompose_lump(0x0020);
    if (uc == 0x2018 || uc == 0x2019 || uc == 0x02BC || uc == 0x02C8)
      utf8proc_decompose_lump(0x0027);
    if (category == UTF8PROC_CATEGORY_PD || uc == 0x2212)
      utf8proc_decompose_lump(0x002D);
    if (uc == 0x2044 || uc == 0x2215) utf8proc_decompose_lump(0x002F);
    if (uc == 0x2236) utf8proc_decompose_lump(0x003A);
    if (uc == 0x2039 || uc == 0x2329 || uc == 0x3008)
      utf8proc_decompose_lump(0x003C);
    if (uc == 0x203A || uc == 0x232A || uc == 0x3009)
      utf8proc_decompose_lump(0x003E);
    if (uc == 0x2216) utf8proc_decompose_lump(0x005C);
    if (uc == 0x02C4 || uc == 0x02C6 || uc == 0x2038 || uc == 0x2303)
      utf8proc_decompose_lump(0x005E);
    if (category == UTF8PROC_CATEGORY_PC || uc == 0x02CD)
      utf8proc_decompose_lump(0x005F);
    if (uc == 0x02CB) utf8proc_decompose_lump(0x0060);
    if (uc == 0x2223) utf8proc_decompose_lump(0x007C);
    if (uc == 0x223C) utf8proc_decompose_lump(0x007E);
    if ((options & UTF8PROC_NLF2LS) && (options & UTF8PROC_NLF2PS)) {
      if (category == UTF8PROC_CATEGORY_ZL ||
          category == UTF8PROC_CATEGORY_ZP)
        utf8proc_decompose_lump(0x000A);
    }
  }
  if (options & UTF8PROC_STRIPMARK) {
    if (category == UTF8PROC_CATEGORY_MN ||
      category == UTF8PROC_CATEGORY_MC ||
      category == UTF8PROC_CATEGORY_ME) return 0;
  }
  if (options & UTF8PROC_CASEFOLD) {
    if (property->casefold_seqindex != UINT16_MAX) {
      return seqindex_write_char_decomposed(property->casefold_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (property->decomp_seqindex != UINT16_MAX &&
        (!property->decomp_type || (options & UTF8PROC_COMPAT))) {
      return seqindex_write_char_decomposed(property->decomp_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & UTF8PROC_CHARBOUND) {
    utf8proc_bool boundary;
    int tbc = property->boundclass;
    boundary = grapheme_break_extended(*last_boundclass, tbc, last_boundclass);
    if (boundary) {
      if (bufsize >= 1) dst[0] = 0xFFFF;
      if (bufsize >= 2) dst[1] = uc;
      return 2;
    }
  }
  if (bufsize >= 1) *dst = uc;
  return 1;
}